

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::move_from(sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
            *this,MoveDontCopyT mover,
           sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
           *ht,size_type min_buckets_wanted)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  destructive_iterator it;
  destructive_iterator local_c0;
  destructive_iterator local_78;
  
  clear(this);
  if (mover == MoveDontGrow) {
    uVar3 = (ht->table).settings.table_size;
  }
  else {
    uVar3 = sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
            min_buckets((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)this,
                        (ht->table).settings.num_buckets - ht->num_deleted,min_buckets_wanted);
  }
  if ((this->table).settings.table_size < uVar3) {
    sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::resize
              (&this->table,uVar3);
    sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
    reset_thresholds((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)this,
                     (this->table).settings.table_size);
  }
  destructive_begin(&local_c0,ht);
  while( true ) {
    destructive_end(&local_78,ht);
    bVar2 = destructive_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>_>
            ::operator!=(&local_c0.pos,&local_78.pos);
    if (!bVar2) break;
    uVar3 = (ulong)*local_c0.pos.col_current;
    lVar4 = 0;
    while( true ) {
      uVar3 = (this->table).settings.table_size - 1 & uVar3;
      bVar2 = sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::test
                        (&this->table,uVar3);
      if (!bVar2) break;
      uVar3 = uVar3 + lVar4 + 1;
      lVar4 = lVar4 + 1;
    }
    sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::set
              (&this->table,uVar3,local_c0.pos.col_current);
    sparse_hashtable_destructive_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::operator++(&local_c0);
  }
  puVar1 = &(this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
            num_ht_copies_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void move_from(MoveDontCopyT mover, sparse_hashtable& ht,
                 size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    size_type resize_to;
    if (mover == MoveDontGrow)
      resize_to = ht.bucket_count();  // keep same size as old ht
    else                              // MoveDontCopy
      resize_to = settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    // THIS IS THE MAJOR LINE THAT DIFFERS FROM COPY_FROM():
    for (destructive_iterator it = ht.destructive_begin();
         it != ht.destructive_end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      for (bucknum = hash(get_key(*it)) & (bucket_count() - 1);  // h % buck_cnt
           table.test(bucknum);                                  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & (bucket_count() - 1)) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }